

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O1

bool __thiscall
leveldb::anon_unknown_0::BloomFilterPolicy::KeyMayMatch
          (BloomFilterPolicy *this,Slice *key,Slice *bloom_filter)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = bloom_filter->size_;
  if (uVar3 < 2) {
    bVar10 = false;
  }
  else {
    pcVar4 = bloom_filter->data_;
    cVar1 = pcVar4[uVar3 - 1];
    uVar9 = (ulong)cVar1;
    if (uVar9 < 0x1f) {
      uVar8 = Hash(key->data_,key->size_,0xbc9f1d34);
      bVar10 = cVar1 == '\0';
      if (bVar10) goto LAB_00d48efa;
      uVar6 = uVar8 << 0xf;
      uVar7 = uVar8 >> 0x11;
      do {
        bVar10 = false;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar3 * 8 - 8;
        if (((byte)pcVar4[SUB168(ZEXT416(uVar8) % auVar5,0) >> 3 & 0x1fffffff] >>
             (SUB164(ZEXT416(uVar8) % auVar5,0) & 7) & 1) == 0) goto LAB_00d48efa;
        uVar8 = uVar8 + (uVar6 | uVar7);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    bVar10 = true;
  }
LAB_00d48efa:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

size_t size() const { return size_; }